

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_DumpGraphIntoFile(Emb_Man_t *p)

{
  uint *puVar1;
  FILE *__stream;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  __stream = fopen("1.g","w");
  if (0 < p->nObjData) {
    uVar4 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      puVar1 = (uint *)(p->pObjData + uVar4);
      if ((puVar1[3] == p->nTravIds) && (0 < (int)puVar1[1])) {
        lVar2 = 0;
        do {
          if (puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar2 + 5] + 3] != p->nTravIds) {
            __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                          ,0x43c,"void Emb_DumpGraphIntoFile(Emb_Man_t *)");
          }
          fprintf(__stream,"%d %d\n",(ulong)puVar1[4],
                  (ulong)puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar2 + 5] + 4]);
          lVar2 = lVar2 + 1;
        } while ((int)lVar2 < (int)puVar1[1]);
      }
      uVar3 = (int)uVar4 + (*puVar1 >> 4) + puVar1[1] + 5;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < p->nObjData);
  }
  fclose(__stream);
  return;
}

Assistant:

void Emb_DumpGraphIntoFile( Emb_Man_t * p )
{
    FILE * pFile;
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    pFile = fopen( "1.g", "w" );
    Emb_ManForEachObj( p, pThis, i )
    {
        if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjForEachFanout( pThis, pNext, k )
        {
            assert( Emb_ObjIsTravIdCurrent(p, pNext) );
            fprintf( pFile, "%d %d\n", pThis->Value, pNext->Value );
        }
    }
    fclose( pFile );
}